

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCstr * lj_parse_keepstr(LexState *ls,char *str,size_t len)

{
  lua_State *L_00;
  TValue *pTVar1;
  lua_State *in_RDX;
  long in_RDI;
  TValue *tv;
  GCstr *s;
  lua_State *L;
  char *in_stack_00000038;
  lua_State *in_stack_00000040;
  GCtab *t;
  
  t = *(GCtab **)(in_RDI + 8);
  L_00 = (lua_State *)lj_str_new(in_stack_00000040,in_stack_00000038,(size_t)ls);
  pTVar1 = lj_tab_setstr(in_RDX,t,(GCstr *)L_00);
  if ((pTVar1->field_2).it == 0xffffffff) {
    (pTVar1->field_2).it = 0xfffffffd;
  }
  if (*(uint *)((ulong)(t->array).ptr32 + 0x54) <= *(uint *)((ulong)(t->array).ptr32 + 0x50)) {
    lj_gc_step(L_00);
  }
  return (GCstr *)L_00;
}

Assistant:

GCstr *lj_parse_keepstr(LexState *ls, const char *str, size_t len)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  GCstr *s = lj_str_new(L, str, len);
  TValue *tv = lj_tab_setstr(L, ls->fs->kt, s);
  if (tvisnil(tv)) setboolV(tv, 1);
  lj_gc_check(L);
  return s;
}